

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

bool __thiscall
cfgfile::details::parser_conffile_impl_t<cfgfile::string_trait_t>::start_first_tag_parsing
          (parser_conffile_impl_t<cfgfile::string_trait_t> *this)

{
  lexical_analyzer_t<cfgfile::string_trait_t> *this_00;
  bool bVar1;
  exception_t<cfgfile::string_trait_t> *peVar2;
  pos_t pos;
  pos_t pos_00;
  pos_t pos_01;
  bool bVar3;
  lexeme_t<cfgfile::string_trait_t> lexeme;
  undefined1 *local_300;
  long local_2f8;
  undefined1 local_2f0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  undefined1 *local_2c0;
  long local_2b8;
  undefined1 local_2b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string_t local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  undefined1 local_1e0 [8];
  _Alloc_hider local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 *local_138;
  long local_130;
  undefined1 local_128 [16];
  undefined1 *local_118;
  long local_110;
  undefined1 local_108 [16];
  lexeme_t<cfgfile::string_trait_t> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string_t local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->m_lex;
  lexical_analyzer_t<cfgfile::string_trait_t>::next_lexeme(&local_f8,this_00);
  if (((this->super_parser_base_t<cfgfile::string_trait_t>).m_tag)->m_is_mandatory == true) {
    if (local_f8.m_type == null) {
      peVar2 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2a0,"Unexpected end of file. Undefined mandatory tag \"","");
      local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_200,local_2a0._M_dataplus._M_p,
                 local_2a0._M_dataplus._M_p + local_2a0._M_string_length);
      std::operator+(&local_1b8,&local_200,
                     &((this->super_parser_base_t<cfgfile::string_trait_t>).m_tag)->m_name);
      local_2c0 = local_2b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"\". In file \"","");
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_240,local_2c0,local_2c0 + local_2b8);
      std::operator+(&local_198,&local_1b8,&local_240);
      std::operator+(&local_178,&local_198,&this_00->m_stream->m_file_name);
      local_300 = local_2f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"\" on line ","");
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_260,local_300,local_300 + local_2f8);
      std::operator+(&local_158,&local_178,&local_260);
      string_trait_t::to_string_abi_cxx11_
                (&local_220,(string_trait_t *)(this->m_lex).m_line_number,pos);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                     &local_158,&local_220);
      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,".","");
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_280,local_2e0._M_dataplus._M_p,
                 local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
      std::operator+(&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                     &local_280);
      exception_t<cfgfile::string_trait_t>::exception_t(peVar2,&local_50);
      __cxa_throw(peVar2,&exception_t<cfgfile::string_trait_t>::typeinfo,
                  exception_t<cfgfile::string_trait_t>::~exception_t);
    }
  }
  else if (local_f8.m_type == null) {
    bVar3 = false;
    goto LAB_0011bc19;
  }
  if (local_f8.m_type != start) {
    peVar2 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2a0,"Expected start curl brace, but we\'ve got \"","");
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_200,local_2a0._M_dataplus._M_p,
               local_2a0._M_dataplus._M_p + local_2a0._M_string_length);
    std::operator+(&local_1b8,&local_200,&local_f8.m_value);
    local_2c0 = local_2b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"\". In file \"","");
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_240,local_2c0,local_2c0 + local_2b8);
    std::operator+(&local_198,&local_1b8,&local_240);
    std::operator+(&local_178,&local_198,&this_00->m_stream->m_file_name);
    local_300 = local_2f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"\" on line ","");
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_260,local_300,local_300 + local_2f8);
    std::operator+(&local_158,&local_178,&local_260);
    string_trait_t::to_string_abi_cxx11_
              (&local_220,(string_trait_t *)(this->m_lex).m_line_number,pos_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                   &local_158,&local_220);
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,".","");
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_280,local_2e0._M_dataplus._M_p,
               local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
    std::operator+(&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                   &local_280);
    exception_t<cfgfile::string_trait_t>::exception_t(peVar2,&local_70);
    __cxa_throw(peVar2,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  lexical_analyzer_t<cfgfile::string_trait_t>::next_lexeme
            ((lexeme_t<cfgfile::string_trait_t> *)local_1e0,this_00);
  local_f8.m_type = local_1e0._0_4_;
  std::__cxx11::string::operator=((string *)&local_f8.m_value,(string *)&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_p != &local_1c8) {
    operator_delete(local_1d8._M_p,local_1c8._M_allocated_capacity + 1);
  }
  bVar1 = start_tag_parsing(this,&local_f8,
                            (this->super_parser_base_t<cfgfile::string_trait_t>).m_tag);
  bVar3 = true;
  if (!bVar1) {
    peVar2 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    local_2c0 = local_2b0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2c0,"Unexpected tag name. We expected \"","");
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_240,local_2c0,local_2c0 + local_2b8);
    std::operator+(&local_2a0,&local_240,
                   &((this->super_parser_base_t<cfgfile::string_trait_t>).m_tag)->m_name);
    local_300 = local_2f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"\", but we\'ve got \"","")
    ;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_260,local_300,local_300 + local_2f8);
    std::operator+(&local_200,&local_2a0,&local_260);
    std::operator+(&local_1b8,&local_200,&local_f8.m_value);
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"\". In file \"","");
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_220,local_280._M_dataplus._M_p,
               local_280._M_dataplus._M_p + local_280._M_string_length);
    std::operator+(&local_198,&local_1b8,&local_220);
    std::operator+(&local_178,&local_198,&this_00->m_stream->m_file_name);
    local_118 = local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"\" on line ","");
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_2e0,local_118,local_118 + local_110);
    std::operator+(&local_158,&local_178,&local_2e0);
    string_trait_t::to_string_abi_cxx11_
              (&local_b0,(string_trait_t *)(this->m_lex).m_line_number,pos_01);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                   &local_158,&local_b0);
    local_138 = local_128;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,".","");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_d0,local_138,local_138 + local_130);
    std::operator+(&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                   &local_d0);
    exception_t<cfgfile::string_trait_t>::exception_t(peVar2,&local_90);
    __cxa_throw(peVar2,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
LAB_0011bc19:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.m_value._M_dataplus._M_p != &local_f8.m_value.field_2) {
    operator_delete(local_f8.m_value._M_dataplus._M_p,
                    local_f8.m_value.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool start_first_tag_parsing()
	{
		lexeme_t< Trait > lexeme = m_lex.next_lexeme();

		if( this->m_tag.is_mandatory() && lexeme.type() == lexeme_type_t::null )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected end of file. "
					"Undefined mandatory tag \"" ) + this->m_tag.name() +
				Trait::from_ascii( "\". In file \"" ) +
				m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
		else if( !this->m_tag.is_mandatory() &&
			lexeme.type() == lexeme_type_t::null )
				return false;
		else if( lexeme.type() != lexeme_type_t::start )
			throw exception_t< Trait >(
				Trait::from_ascii( "Expected start curl brace, "
					"but we've got \"" ) + lexeme.value() +
				Trait::from_ascii( "\". In file \"" ) +
				m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );

		lexeme = m_lex.next_lexeme();

		if( !start_tag_parsing( lexeme, this->m_tag ) )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected tag name. "
					"We expected \"" ) + this->m_tag.name() +
				Trait::from_ascii( "\", but we've got \"" ) + lexeme.value() +
				Trait::from_ascii( "\". In file \"" ) +
				m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );

		return true;
	}